

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

int __thiscall Process::yesOrNo(Process *this,double probability)

{
  uint uVar1;
  ulong uVar2;
  size_t __i;
  long lVar3;
  double dVar4;
  mt19937 mersenne;
  random_device rd;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2718;
  random_device local_1390;
  
  yesOrNo::sum = yesOrNo::sum + probability;
  std::random_device::random_device(&local_1390);
  uVar1 = std::random_device::_M_getval();
  local_2718._M_x[0] = (unsigned_long)uVar1;
  lVar3 = 1;
  uVar2 = local_2718._M_x[0];
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
    local_2718._M_x[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_2718._M_p = 0x270;
  dVar4 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (&local_2718);
  std::random_device::_M_fini();
  return (int)(dVar4 <= probability);
}

Assistant:

int Process::yesOrNo(double probability){
    static double sum = 0;
    sum += probability;
    std::random_device rd;
    std::mt19937 mersenne(rd());
    std::uniform_real_distribution<> urd(0, 1);
    auto a = urd(mersenne);
    return a <= probability ? 1 : 0;
}